

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TImage.cpp
# Opt level: O2

void __thiscall TUPU::TImage::TImage(TImage *this,TImage *img)

{
  this->_vptr_TImage = (_func_int **)&PTR__TImage_00503d28;
  (this->m_url)._M_dataplus._M_p = (pointer)&(this->m_url).field_2;
  (this->m_url)._M_string_length = 0;
  (this->m_url).field_2._M_local_buf[0] = '\0';
  (this->m_path)._M_dataplus._M_p = (pointer)&(this->m_path).field_2;
  (this->m_path)._M_string_length = 0;
  (this->m_path).field_2._M_local_buf[0] = '\0';
  (this->m_tag)._M_dataplus._M_p = (pointer)&(this->m_tag).field_2;
  (this->m_tag)._M_string_length = 0;
  (this->m_tag).field_2._M_local_buf[0] = '\0';
  (this->m_sequenceId)._M_dataplus._M_p = (pointer)&(this->m_sequenceId).field_2;
  (this->m_sequenceId)._M_string_length = 0;
  (this->m_sequenceId).field_2._M_local_buf[0] = '\0';
  this->m_buffer = (void *)0x0;
  this->m_len = 0;
  (this->m_filename)._M_dataplus._M_p = (pointer)&(this->m_filename).field_2;
  (this->m_filename)._M_string_length = 0;
  (this->m_filename).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->m_tag);
  std::__cxx11::string::_M_assign((string *)&this->m_sequenceId);
  if (img->m_buffer == (void *)0x0) {
    std::__cxx11::string::_M_assign((string *)&this->m_url);
    std::__cxx11::string::_M_assign((string *)&this->m_path);
  }
  else {
    setBinary(this,img->m_buffer,img->m_len,&img->m_filename);
  }
  return;
}

Assistant:

TImage::TImage(const TImage & img)
    : m_buffer(NULL)
    , m_len(0)
{
    m_tag = img.m_tag;
    m_sequenceId = img.m_sequenceId;
    if (img.m_buffer) {
        setBinary(img.m_buffer, img.m_len, img.m_filename);
    } else {
        m_url = img.m_url;
        m_path = img.m_path;
    }
}